

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

void __thiscall
Shell::Options::strategySamplingAssign
          (Options *this,string *optname,string *value,
          DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
          *fakes)

{
  bool bVar1;
  char *pcVar2;
  AbstractOptionValue *pAVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  UserErrorException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string *in_RDX;
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  AbstractOptionValue *opt;
  string *in_stack_fffffffffffffe88;
  UserErrorException *in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffe98;
  AbstractOptionValue *this_01;
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *this_02;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  undefined1 uVar4;
  string *in_stack_ffffffffffffff20;
  Options *in_stack_ffffffffffffff28;
  undefined1 local_98 [88];
  string local_40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  this_02 = in_RSI;
  local_20 = in_RCX;
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
  if (*pcVar2 == '$') {
    std::__cxx11::string::string(local_40,(string *)this_02);
    std::__cxx11::string::string((string *)(local_98 + 0x38),in_RDX);
    Lib::
    DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
    ::set(this_02,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
          local_20);
    std::__cxx11::string::~string((string *)(local_98 + 0x38));
    std::__cxx11::string::~string(local_40);
  }
  else {
    this_01 = (AbstractOptionValue *)local_98;
    std::__cxx11::string::string((string *)this_01,(string *)this_02);
    pAVar3 = getOptionValueByName(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::__cxx11::string::~string((string *)local_98);
    local_98._32_8_ = pAVar3;
    if (pAVar3 == (AbstractOptionValue *)0x0) {
      uVar4 = 1;
      this_00 = (UserErrorException *)__cxa_allocate_exception(0x50);
      std::operator+((char *)CONCAT17(uVar4,in_stack_fffffffffffffed8),in_RDI);
      Lib::UserErrorException::Exception(this_00,in_stack_fffffffffffffe88);
      __cxa_throw(this_00,&Lib::UserErrorException::typeinfo,
                  Lib::UserErrorException::~UserErrorException);
    }
    bVar1 = AbstractOptionValue::set
                      (this_01,in_stack_fffffffffffffe98,
                       SUB81((ulong)in_stack_fffffffffffffe90 >> 0x38,0));
    if (!bVar1) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x50);
      std::operator+((char *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),in_RDI);
      std::operator+(__lhs,(char *)in_stack_fffffffffffffe90);
      std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffe90);
      Lib::UserErrorException::Exception(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      __cxa_throw(__lhs,&Lib::UserErrorException::typeinfo,
                  Lib::UserErrorException::~UserErrorException);
    }
  }
  return;
}

Assistant:

void Options::strategySamplingAssign(std::string optname, std::string value, DHMap<std::string,std::string>& fakes)
{
  // dollar sign signifies fake options
  if (optname[0] == '$') {
    fakes.set(optname,value);
    return;
  }

  AbstractOptionValue* opt = getOptionValueByName(optname);
  if (opt) {
    if (!opt->set(value,/* dont_touch_if_defaulting =*/ true)) {
      USER_ERROR("Sampling file processing error -- unknown option value: " + value + " for option " + optname);
    }

  } else {
    USER_ERROR("Sampling file processing error -- unknown option: " + optname);
  }
}